

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusproxy.cpp
# Opt level: O2

QIBusEngineDesc * __thiscall
QIBusProxy::getGlobalEngine(QIBusEngineDesc *__return_storage_ptr__,QIBusProxy *this)

{
  long in_FS_OFFSET;
  QDBusArgument argument;
  QDBusReply<QDBusVariant> reply;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  ulong uStack_b0;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  ulong uStack_90;
  QDBusReply<QDBusVariant> local_88;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0xaa,0x1a8);
  QIBusEngineDesc::QIBusEngineDesc(__return_storage_ptr__);
  local_88.m_data.m_variant.d.data._16_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88.m_data.m_variant.d._24_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88.m_data.m_variant.d.data.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_88.m_data.m_variant.d.data._8_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._48_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._56_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._32_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._40_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._16_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88._24_8_ = 0xaaaaaaaaaaaaaaaa;
  local_88.m_error = (QDBusError)0xaa;
  local_88._1_7_ = 0xaaaaaaaaaaaaaa;
  local_88._8_8_ = 0xaaaaaaaaaaaaaaaa;
  GlobalEngine((QIBusProxy *)local_a8.data);
  QDBusReply<QDBusVariant>::QDBusReply(&local_88,(QDBusPendingCall *)local_a8.data);
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)local_a8.data);
  local_a8._16_8_ = 0xaaaaaaaaaaaaaaaa;
  uStack_90 = 0xaaaaaaaaaaaaaaaa;
  local_a8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  local_a8._8_8_ = 0xaaaaaaaaaaaaaaaa;
  QVariant::QVariant((QVariant *)&local_c8,&local_88.m_data.m_variant);
  QVariant::QVariant((QVariant *)&local_a8,(QVariant *)&local_c8);
  QVariant::~QVariant((QVariant *)&local_c8);
  if (3 < uStack_90) {
    local_c8._16_8_ = 0xaaaaaaaaaaaaaaaa;
    uStack_b0 = 0xaaaaaaaaaaaaaaaa;
    local_c8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_c8._8_8_ = 0xaaaaaaaaaaaaaaaa;
    qvariant_cast<QDBusVariant>((QDBusVariant *)&local_e8,(QVariant *)&local_a8);
    QVariant::QVariant((QVariant *)&local_c8,(QVariant *)&local_e8);
    QVariant::~QVariant((QVariant *)&local_e8);
    if (3 < uStack_b0) {
      local_e8.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
      qvariant_cast<QDBusArgument>((QVariant *)&local_e8);
      QIBusEngineDesc::deserializeFrom(__return_storage_ptr__,(QDBusArgument *)&local_e8.shared);
      QDBusArgument::~QDBusArgument((QDBusArgument *)&local_e8.shared);
    }
    QVariant::~QVariant((QVariant *)&local_c8);
  }
  QVariant::~QVariant((QVariant *)&local_a8);
  QDBusReply<QDBusVariant>::~QDBusReply(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QIBusEngineDesc QIBusProxy::getGlobalEngine()
{
    QIBusEngineDesc desc;
    QDBusReply<QDBusVariant> reply = GlobalEngine();
    QVariant variant = reply.value().variant();
    if (!variant.isValid())
        return desc;
    QVariant child = qvariant_cast<QDBusVariant>(variant).variant();
    if (!child.isValid())
        return desc;
    const QDBusArgument argument = qvariant_cast<QDBusArgument>(child);
    argument >> desc;
    return desc;
}